

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

boolean create_particular(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  permonst *ptr;
  monst *mtmp;
  long lVar5;
  int iVar6;
  boolean bVar7;
  int iVar8;
  bool bVar9;
  char buf [256];
  int local_14c;
  int local_148;
  char local_138 [264];
  
  local_14c = 0x3d;
  iVar6 = 0;
  do {
    iVar8 = (int)urole.malenum;
    getlin("Create what kind of monster? [type the name or symbol]",local_138);
    pcVar3 = mungspaces(local_138);
    if (*pcVar3 == '\x1b') goto LAB_00230fde;
    lVar5 = 5;
    iVar1 = strncasecmp(pcVar3,"tame ",5);
    if (iVar1 == 0) {
      local_148 = 0;
LAB_00230e1f:
      bVar9 = false;
    }
    else {
      lVar5 = 9;
      iVar2 = strncasecmp(pcVar3,"peaceful ",9);
      if (iVar2 == 0) {
        local_148 = 1;
        goto LAB_00230e1f;
      }
      iVar2 = strncasecmp(pcVar3,"hostile ",8);
      bVar9 = iVar2 == 0;
      lVar5 = (ulong)bVar9 << 3;
      local_148 = 0;
    }
    pcVar3 = pcVar3 + lVar5;
    sVar4 = strlen(pcVar3);
    if (sVar4 == 1) {
      local_14c = def_char_to_monclass(*pcVar3);
      if ((char)local_14c != '=') goto LAB_00230e77;
    }
    else {
      iVar8 = name_to_mon(pcVar3);
      if (-1 < iVar8) goto LAB_00230e77;
    }
    pline("I\'ve never heard of such monsters.");
    iVar6 = iVar6 + 1;
  } while (iVar6 != 5);
  iVar6 = 5;
LAB_00230e77:
  if (iVar6 == 5) {
    pline("That\'s enough tries!");
    return '\0';
  }
  if (iVar8 < 0x11c) {
    if ((iVar8 != 0x7f) && (iVar8 != 0x11a)) goto LAB_00230ed2;
  }
  else if (iVar8 != 0x11c) {
    if (iVar8 == 0x158) {
      iVar8 = 0x76;
      goto LAB_00230ed2;
    }
    if (iVar8 != 0x11f) goto LAB_00230ed2;
  }
  iVar8 = 0xfa;
LAB_00230ed2:
  if (multi < 0) {
LAB_00230fde:
    bVar7 = '\0';
  }
  else {
    ptr = mons + iVar8;
    iVar6 = -1;
    bVar7 = '\0';
    do {
      if ((char)local_14c != '=') {
        ptr = mkclass(&u.uz,(char)local_14c,0);
      }
      if (iVar1 == 0) {
        mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,4);
        if (mtmp != (monst *)0x0) {
          initedog(mtmp);
          goto LAB_00230fac;
        }
        mtmp = (monst *)0x0;
      }
      else {
        mtmp = makemon(ptr,level,(int)u.ux,(int)u.uy,0);
        if ((mtmp != (monst *)0x0 & (bVar9 | (byte)local_148)) == 1) {
          mtmp->mtame = '\0';
          *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffbfffff | local_148 << 0x16;
LAB_00230fac:
          set_malign(mtmp);
        }
      }
      if (mtmp != (monst *)0x0) {
        bVar7 = '\x01';
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < multi);
  }
  return bVar7;
}

Assistant:

boolean create_particular(void)
{
	char buf[BUFSZ], *bufp, monclass = MAXMCLASSES;
	int which, tries, i;
	const struct permonst *whichpm;
	struct monst *mtmp;
	boolean madeany = FALSE;
	boolean maketame, makepeaceful, makehostile;

	tries = 0;
	do {
	    which = urole.malenum;	/* an arbitrary index into mons[] */
	    maketame = makepeaceful = makehostile = FALSE;
	    getlin("Create what kind of monster? [type the name or symbol]",
		   buf);
	    bufp = mungspaces(buf);
	    if (*bufp == '\033') return FALSE;
	    /* allow the initial disposition to be specified */
	    if (!strncmpi(bufp, "tame ", 5)) {
		bufp += 5;
		maketame = TRUE;
	    } else if (!strncmpi(bufp, "peaceful ", 9)) {
		bufp += 9;
		makepeaceful = TRUE;
	    } else if (!strncmpi(bufp, "hostile ", 8)) {
		bufp += 8;
		makehostile = TRUE;
	    }
	    /* decide whether a valid monster was chosen */
	    if (strlen(bufp) == 1) {
		monclass = def_char_to_monclass(*bufp);
		if (monclass != MAXMCLASSES) break;	/* got one */
	    } else {
		which = name_to_mon(bufp);
		if (which >= LOW_PM) break;		/* got one */
	    }
	    /* no good; try again... */
	    pline("I've never heard of such monsters.");
	} while (++tries < 5);

	if (tries == 5) {
	    pline("That's enough tries!");
	} else {
	    cant_create(&which, FALSE);
	    whichpm = &mons[which];
	    for (i = 0; i <= multi; i++) {
		if (monclass != MAXMCLASSES)
		    whichpm = mkclass(&u.uz, monclass, 0);
		if (maketame) {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, MM_EDOG);
		    if (mtmp) {
			initedog(mtmp);
			set_malign(mtmp);
		    }
		} else {
		    mtmp = makemon(whichpm, level, u.ux, u.uy, NO_MM_FLAGS);
		    if ((makepeaceful || makehostile) && mtmp) {
			mtmp->mtame = 0;	/* sanity precaution */
			mtmp->mpeaceful = makepeaceful ? 1 : 0;
			set_malign(mtmp);
		    }
		}
		if (mtmp) madeany = TRUE;
	    }
	}
	return madeany;
}